

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

void __thiscall
cmOutputRequiredFilesCommand::ListDependencies
          (cmOutputRequiredFilesCommand *this,cmDependInformation *info,FILE *fout,
          set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
          *visited)

{
  _Rb_tree_node_base *__k;
  bool bVar1;
  iterator iVar2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  cmDependInformation *info_local;
  _Base_ptr local_88;
  long local_80;
  cmOutputRequiredFilesCommand *local_78;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  info_local = info;
  local_78 = this;
  std::
  _Rb_tree<cmDependInformation_const*,cmDependInformation_const*,std::_Identity<cmDependInformation_const*>,std::less<cmDependInformation_const*>,std::allocator<cmDependInformation_const*>>
  ::_M_insert_unique<cmDependInformation_const*const&>
            ((_Rb_tree<cmDependInformation_const*,cmDependInformation_const*,std::_Identity<cmDependInformation_const*>,std::less<cmDependInformation_const*>,std::allocator<cmDependInformation_const*>>
              *)visited,&info_local);
  p_Var5 = &(visited->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_88 = p_Var5;
  for (p_Var4 = (info_local->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(info_local->DependencySet)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    __k = p_Var4 + 1;
    iVar2 = std::
            _Rb_tree<const_cmDependInformation_*,_const_cmDependInformation_*,_std::_Identity<const_cmDependInformation_*>,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
            ::find(&visited->_M_t,(key_type *)__k);
    if (iVar2._M_node == p_Var5) {
      bVar1 = std::operator!=(&info_local->FullPath,"");
      if (bVar1) {
        std::__cxx11::string::string((string *)&tmp,(string *)&(*(key_type *)__k)->FullPath);
        lVar3 = std::__cxx11::string::rfind((char)&tmp,0x2e);
        if (lVar3 != -1) {
          local_80 = lVar3;
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&tmp);
          bVar1 = std::operator!=(&local_50,".h");
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar1) {
            std::__cxx11::string::substr((ulong)&local_50,(ulong)&tmp);
            std::__cxx11::string::operator=((string *)&tmp,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            fprintf((FILE *)fout,"%s\n",((*(key_type *)__k)->FullPath)._M_dataplus._M_p);
          }
        }
        std::__cxx11::string::~string((string *)&tmp);
        p_Var5 = local_88;
      }
      ListDependencies(local_78,*(cmDependInformation **)__k,fout,visited);
    }
  }
  return;
}

Assistant:

void cmOutputRequiredFilesCommand::
ListDependencies(cmDependInformation const *info,
                 FILE *fout,
                 std::set<cmDependInformation const*> *visited)
{
  // add info to the visited set
  visited->insert(info);
  // now recurse with info's dependencies
  for(cmDependInformation::DependencySetType::const_iterator d =
        info->DependencySet.begin();
      d != info->DependencySet.end(); ++d)
    {
    if (visited->find(*d) == visited->end())
      {
      if(info->FullPath != "")
        {
        std::string tmp = (*d)->FullPath;
        std::string::size_type pos = tmp.rfind('.');
        if(pos != std::string::npos && (tmp.substr(pos) != ".h"))
          {
          tmp = tmp.substr(0, pos);
          fprintf(fout,"%s\n",(*d)->FullPath.c_str());
          }
        }
      this->ListDependencies(*d,fout,visited);
      }
    }
}